

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_encode_chunks(spng_ctx *ctx)

{
  int iVar1;
  int ret;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else if (ctx->state == SPNG_STATE_INVALID) {
    ctx_local._4_4_ = 0x46;
  }
  else if (ctx->state < SPNG_STATE_INPUT) {
    ctx_local._4_4_ = 0x53;
  }
  else if ((*(ushort *)&ctx->field_0xcc >> 4 & 1) == 0) {
    ctx_local._4_4_ = 0x51;
  }
  else {
    if (ctx->state < SPNG_STATE_FIRST_IDAT) {
      if (((uint)ctx->stored & 1) == 0) {
        return 0xf;
      }
      iVar1 = write_chunks_before_idat(ctx);
      if (iVar1 != 0) {
        iVar1 = encode_err(ctx,iVar1);
        return iVar1;
      }
      ctx->state = SPNG_STATE_FIRST_IDAT;
    }
    else {
      if (ctx->state == SPNG_STATE_FIRST_IDAT) {
        return 0;
      }
      if (ctx->state != SPNG_STATE_EOI) {
        return 0x54;
      }
      iVar1 = write_chunks_after_idat(ctx);
      if (iVar1 != 0) {
        iVar1 = encode_err(ctx,iVar1);
        return iVar1;
      }
      ctx->state = SPNG_STATE_IEND;
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_encode_chunks(spng_ctx *ctx)
{
    if(ctx == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;
    if(ctx->state < SPNG_STATE_OUTPUT) return SPNG_ENODST;
    if(!ctx->encode_only) return SPNG_ECTXTYPE;

    int ret = 0;

    if(ctx->state < SPNG_STATE_FIRST_IDAT)
    {
        if(!ctx->stored.ihdr) return SPNG_ENOIHDR;

        ret = write_chunks_before_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_FIRST_IDAT;
    }
    else if(ctx->state == SPNG_STATE_FIRST_IDAT)
    {
        return 0;
    }
    else if(ctx->state == SPNG_STATE_EOI)
    {
        ret = write_chunks_after_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_IEND;
    }
    else return SPNG_EOPSTATE;

    return 0;
}